

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

void __thiscall
mjs::interpreter::impl::check_strict_mode_put(impl *this,object_ptr *o,wstring_view p)

{
  bool bVar1;
  property_attribute attributes;
  long *plVar2;
  void *pvVar3;
  wostream *pwVar4;
  native_error_exception *pnVar5;
  wstring_view *s;
  wstring_view *s_00;
  wstring_view *s_01;
  wostringstream woss;
  wstring local_208;
  wstring_view local_1e8;
  wchar_t *local_1d8;
  size_t local_1d0;
  size_t local_1b8;
  wchar_t *local_1b0;
  wstring_view local_1a8;
  wostringstream local_198 [376];
  
  local_1b0 = p._M_str;
  local_1b8 = p._M_len;
  if ((o->super_gc_heap_ptr_untyped).heap_ == (gc_heap *)0x0) {
    std::__cxx11::wostringstream::wostringstream(local_198);
    cpp_quote_abi_cxx11_(&local_208,(mjs *)&local_1b8,s_00);
    pwVar4 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                       ((wostream *)local_198,local_208._M_dataplus._M_p,local_208._M_string_length)
    ;
    std::operator<<(pwVar4," is not defined");
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity * 4 + 4);
    }
    pnVar5 = (native_error_exception *)__cxa_allocate_exception(0x58);
    stack_trace_abi_cxx11_(&local_208,this);
    local_1e8._M_len = local_208._M_string_length;
    local_1e8._M_str = local_208._M_dataplus._M_p;
    std::__cxx11::wstringbuf::str();
    local_1a8._M_len = local_1d0;
    local_1a8._M_str = local_1d8;
    native_error_exception::native_error_exception(pnVar5,reference,&local_1e8,&local_1a8);
    __cxa_throw(pnVar5,&native_error_exception::typeinfo,
                native_error_exception::~native_error_exception);
  }
  plVar2 = (long *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
  attributes = (**(code **)(*plVar2 + 0x30))(plVar2,&local_1b8);
  if (attributes < (invalid|read_only)) {
    if (attributes == invalid) {
      pvVar3 = gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
      if (*(char *)((long)pvVar3 + 0x1c) == '\0') {
        std::__cxx11::wostringstream::wostringstream(local_198);
        pwVar4 = std::operator<<((wostream *)local_198,"Cannot add property ");
        cpp_quote_abi_cxx11_(&local_208,(mjs *)&local_1b8,s);
        pwVar4 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                           (pwVar4,local_208._M_dataplus._M_p,local_208._M_string_length);
        std::operator<<(pwVar4," to non-extensible object in strict mode");
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity * 4 + 4
                         );
        }
        pnVar5 = (native_error_exception *)__cxa_allocate_exception(0x58);
        stack_trace_abi_cxx11_(&local_208,this);
        local_1e8._M_len = local_208._M_string_length;
        local_1e8._M_str = local_208._M_dataplus._M_p;
        std::__cxx11::wstringbuf::str();
        local_1a8._M_len = local_1d0;
        local_1a8._M_str = local_1d8;
        native_error_exception::native_error_exception(pnVar5,type,&local_1e8,&local_1a8);
        __cxa_throw(pnVar5,&native_error_exception::typeinfo,
                    native_error_exception::~native_error_exception);
      }
    }
    else {
      bVar1 = has_attributes(attributes,read_only);
      if (bVar1) {
        std::__cxx11::wostringstream::wostringstream(local_198);
        pwVar4 = std::operator<<((wostream *)local_198,"Cannot assign to read only property ");
        cpp_quote_abi_cxx11_(&local_208,(mjs *)&local_1b8,s_01);
        pwVar4 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                           (pwVar4,local_208._M_dataplus._M_p,local_208._M_string_length);
        std::operator<<(pwVar4," in strict mode");
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity * 4 + 4
                         );
        }
        pnVar5 = (native_error_exception *)__cxa_allocate_exception(0x58);
        stack_trace_abi_cxx11_(&local_208,this);
        local_1e8._M_len = local_208._M_string_length;
        local_1e8._M_str = local_208._M_dataplus._M_p;
        std::__cxx11::wstringbuf::str();
        local_1a8._M_len = local_1d0;
        local_1a8._M_str = local_1d8;
        native_error_exception::native_error_exception(pnVar5,type,&local_1e8,&local_1a8);
        __cxa_throw(pnVar5,&native_error_exception::typeinfo,
                    native_error_exception::~native_error_exception);
      }
    }
    return;
  }
  __assert_fail("static_cast<unsigned>(a) <= static_cast<unsigned>(property_attribute::invalid)",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/property_attribute.h"
                ,0x24,"bool mjs::is_valid(property_attribute)");
}

Assistant:

void check_strict_mode_put(const object_ptr& o, const std::wstring_view p) const {
        if (!o) {
            std::wostringstream woss;
            woss << cpp_quote(p) << " is not defined";
            throw native_error_exception{native_error_type::reference, stack_trace(), woss.str()};
        }

        // ES5.1, 11.13.1
        if (const auto a = o->own_property_attributes(p); is_valid(a)) {
            if (!has_attributes(a, property_attribute::read_only)) {
                // OK property is writable
                return;
            }
            std::wostringstream woss;
            woss << "Cannot assign to read only property " << cpp_quote(p) << " in strict mode";
            throw native_error_exception{native_error_type::type, stack_trace(), woss.str()};
        }

        if (o->is_extensible()) {
            // OK property doesn't exist, but object is extensible
            return;
        }

        std::wostringstream woss;
        woss << "Cannot add property " << cpp_quote(p) << " to non-extensible object in strict mode";
        throw native_error_exception{native_error_type::type, stack_trace(), woss.str()};
    }